

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnificationWithAbstraction.cpp
# Opt level: O0

FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *
Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::
_mul(AbstractingUnifier *au,Numeral *k,
    FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *s)

{
  byte bVar1;
  FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *in_RCX;
  anon_class_8_1_54a3980b *in_RDX;
  FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *in_RDI;
  anon_class_8_1_54a3980b procArray;
  FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *pFVar2;
  undefined7 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffffb8;
  RationalConstantType *in_stack_ffffffffffffffc0;
  
  pFVar2 = in_RDI;
  RationalConstantType::RationalConstantType
            ((RationalConstantType *)&stack0xffffffffffffffc0,(RationalConstantType *)in_RDI);
  bVar1 = Kernel::operator==(in_stack_ffffffffffffffc0,(int *)(ulong)in_stack_ffffffffffffffb8);
  RationalConstantType::~RationalConstantType((RationalConstantType *)in_RDI);
  if ((bVar1 & 1) == 0) {
    Lib::
    Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::operator*((Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)0x9e86b3);
    FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>>::
    _mul(Kernel::AbstractingUnifier&,Kernel::RationalConstantType_const&,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>>)
    ::{lambda(auto:1&)#1}::operator()
              (in_RDX,(Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
                      CONCAT17(bVar1,in_stack_ffffffffffffff98));
    Lib::
    Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::operator*((Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)0x9e86cd);
    FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>>::
    _mul(Kernel::AbstractingUnifier&,Kernel::RationalConstantType_const&,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>>)
    ::{lambda(auto:1&)#1}::operator()
              (in_RDX,(Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
                      CONCAT17(bVar1,in_stack_ffffffffffffff98));
    Lib::
    Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::operator*((Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)0x9e86e7);
    FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>>::
    _mul(Kernel::AbstractingUnifier&,Kernel::RationalConstantType_const&,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>>)
    ::{lambda(auto:1&)#1}::operator()
              (in_RDX,(Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
                      CONCAT17(bVar1,in_stack_ffffffffffffff98));
    Lib::
    Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::operator*((Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)0x9e8701);
    FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>>::
    _mul(Kernel::AbstractingUnifier&,Kernel::RationalConstantType_const&,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>>)
    ::{lambda(auto:1&)#1}::operator()
              (in_RDX,(Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
                      CONCAT17(bVar1,in_stack_ffffffffffffff98));
    Lib::
    Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::operator*((Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)0x9e871b);
    FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>>::
    _mul(Kernel::AbstractingUnifier&,Kernel::RationalConstantType_const&,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>>)
    ::{lambda(auto:1&)#1}::operator()
              (in_RDX,(Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
                      CONCAT17(bVar1,in_stack_ffffffffffffff98));
    FloorUwaState(in_RDI,in_RCX);
  }
  else {
    zero();
  }
  return pFVar2;
}

Assistant:

static FloorUwaState _mul(AbstractingUnifier& au, Numeral const& k, FloorUwaState s) {
    if (k == 0) {
      return FloorUwaState::zero();
    } else {
      auto procArray = [&](auto& sum) { 
        for (auto& s : sum) {
          s.second *= k;
        }
      };
      procArray(*s.ratVars);
      procArray(*s.intVars);
      procArray(*s.mixVars);
      procArray(*s.ratAtoms);
      procArray(*s.intAtoms);
      return s;
    }
  }